

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

void __thiscall
gl4cts::EnhancedLayouts::XFBStrideOfEmptyListTest::getShaderBody
          (XFBStrideOfEmptyListTest *this,GLuint param_1,STAGES stage,string *out_assignments,
          string *out_calculations)

{
  char *pcVar1;
  bool *__s;
  
  std::__cxx11::string::_M_replace
            ((ulong)out_calculations,0,(char *)out_calculations->_M_string_length,0x1b32ab9);
  pcVar1 = "    gs_fs  = uni_gs;\n";
  if (stage != GEOMETRY) {
    pcVar1 = glcts::fixed_sample_locations_values + 1;
  }
  __s = (bool *)"    fs_out = vec4(gs_fs);\n";
  if (stage != FRAGMENT) {
    __s = (bool *)pcVar1;
  }
  pcVar1 = (char *)out_assignments->_M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)out_assignments,0,pcVar1,(ulong)__s);
  return;
}

Assistant:

void XFBStrideOfEmptyListTest::getShaderBody(GLuint /* test_case_index */, Utils::Shader::STAGES stage,
											 std::string& out_assignments, std::string& out_calculations)
{
	out_calculations = "";

	static const GLchar* gs = "    gs_fs  = uni_gs;\n";
	static const GLchar* fs = "    fs_out = vec4(gs_fs);\n";

	const GLchar* assignments = "";
	switch (stage)
	{
	case Utils::Shader::FRAGMENT:
		assignments = fs;
		break;
	case Utils::Shader::GEOMETRY:
		assignments = gs;
		break;
	default:
		break;
	}

	out_assignments = assignments;
}